

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableTest_MaxSizeAndMaxBucketCount_Test::TestBody
          (HashtableTest_MaxSizeAndMaxBucketCount_Test *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  undefined1 uVar4;
  size_type sVar5;
  size_type sVar6;
  AssertHelper *this_00;
  AssertHelper *this_01;
  AssertHelper *this_02;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_> ht_104;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_> ht_char;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ht_default;
  allocator_type *in_stack_fffffffffffffc50;
  undefined5 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5d;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  hasher *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc6d;
  undefined1 in_stack_fffffffffffffc6e;
  size_type in_stack_fffffffffffffc6f;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffc70;
  Type in_stack_fffffffffffffc7c;
  Type type;
  AssertHelper *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffcc8;
  uint i;
  AssertionResult local_2f8 [2];
  size_type local_2d2;
  size_type local_2d1;
  AssertionResult local_2d0 [2];
  AssertHelper *local_2b0;
  size_type local_2a8;
  AssertionResult local_2a0 [2];
  size_type local_27d;
  undefined4 local_27c;
  AssertionResult local_278 [2];
  size_type local_255;
  undefined4 local_254;
  AssertionResult local_250 [2];
  undefined4 local_22c;
  size_type local_228;
  AssertionResult local_220;
  Alloc<int,_unsigned_char,_(unsigned_char)_h_> local_210;
  Hasher local_200;
  Hasher local_1f4 [11];
  Alloc<int,_unsigned_char,_(unsigned_char)__xff_> local_170;
  Hasher local_160;
  Hasher local_154 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c0;
  Hasher local_b0;
  Hasher local_a4 [13];
  
  i = 0;
  Hasher::Hasher(local_a4,0);
  Hasher::Hasher(&local_b0,i);
  this_02 = (AssertHelper *)(ulong)i;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c0,i,(int *)this_02);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  sparse_hash_set(in_stack_fffffffffffffc70,
                  CONCAT17(in_stack_fffffffffffffc6f,
                           CONCAT16(in_stack_fffffffffffffc6e,
                                    CONCAT15(in_stack_fffffffffffffc6d,
                                             CONCAT14(in_stack_fffffffffffffc6c,
                                                      in_stack_fffffffffffffc68)))),
                  in_stack_fffffffffffffc60,
                  (key_equal *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58))),
                  (allocator_type *)in_stack_fffffffffffffc50);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c0);
  Hasher::Hasher(local_154,0);
  Hasher::Hasher(&local_160,0);
  Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>::Alloc(&local_170,0,(int *)0x0);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::
  sparse_hash_set((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                   *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6f,in_stack_fffffffffffffc60,
                  (key_equal *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58))),
                  (allocator_type *)in_stack_fffffffffffffc50);
  Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>::~Alloc(&local_170);
  Hasher::Hasher(local_1f4,0);
  Hasher::Hasher(&local_200,0);
  Alloc<int,_unsigned_char,_(unsigned_char)'h'>::Alloc(&local_210,0,(int *)0x0);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>::
  sparse_hash_set((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>
                   *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6f,in_stack_fffffffffffffc60,
                  (key_equal *)
                  CONCAT17(in_stack_fffffffffffffc5f,
                           CONCAT16(in_stack_fffffffffffffc5e,
                                    CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58))),
                  in_stack_fffffffffffffc50);
  Alloc<int,_unsigned_char,_(unsigned_char)'h'>::~Alloc(&local_210);
  local_228 = google::
              sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::max_size((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)0x9df7ee);
  local_22c = 0x100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,
                                       CONCAT15(in_stack_fffffffffffffc6d,
                                                CONCAT14(in_stack_fffffffffffffc6c,
                                                         in_stack_fffffffffffffc68)))),
             (char *)in_stack_fffffffffffffc60,
             (unsigned_long *)
             CONCAT17(in_stack_fffffffffffffc5f,
                      CONCAT16(in_stack_fffffffffffffc5e,
                               CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58))),
             (uint *)in_stack_fffffffffffffc50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    testing::AssertionResult::failure_message((AssertionResult *)0x9df951);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)in_stack_fffffffffffffc70
               ,CONCAT13(in_stack_fffffffffffffc6f,
                         CONCAT12(in_stack_fffffffffffffc6e,
                                  CONCAT11(in_stack_fffffffffffffc6d,in_stack_fffffffffffffc6c))),
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffcc8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x9df9ae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9dfa06);
  local_254 = 0xff;
  local_255 = google::
              sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
              ::max_size((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                          *)0x9dfa1e);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_char,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,
                                       CONCAT15(in_stack_fffffffffffffc6d,
                                                CONCAT14(in_stack_fffffffffffffc6c,
                                                         in_stack_fffffffffffffc68)))),
             (char *)in_stack_fffffffffffffc60,
             (uint *)CONCAT17(in_stack_fffffffffffffc5f,
                              CONCAT16(in_stack_fffffffffffffc5e,
                                       CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58)
                                      )),(uchar *)in_stack_fffffffffffffc50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_250);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    testing::AssertionResult::failure_message((AssertionResult *)0x9dfac5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)in_stack_fffffffffffffc70
               ,CONCAT13(in_stack_fffffffffffffc6f,
                         CONCAT12(in_stack_fffffffffffffc6e,
                                  CONCAT11(in_stack_fffffffffffffc6d,in_stack_fffffffffffffc6c))),
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffcc8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x9dfb22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9dfb7a);
  local_27c = 0x68;
  local_27d = google::
              sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>::
              max_size((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>
                        *)0x9dfb92);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_char,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,
                                       CONCAT15(in_stack_fffffffffffffc6d,
                                                CONCAT14(in_stack_fffffffffffffc6c,
                                                         in_stack_fffffffffffffc68)))),
             (char *)in_stack_fffffffffffffc60,
             (uint *)CONCAT17(in_stack_fffffffffffffc5f,
                              CONCAT16(in_stack_fffffffffffffc5e,
                                       CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58)
                                      )),(uchar *)in_stack_fffffffffffffc50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    testing::AssertionResult::failure_message((AssertionResult *)0x9dfc39);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)in_stack_fffffffffffffc70
               ,CONCAT13(in_stack_fffffffffffffc6f,
                         CONCAT12(in_stack_fffffffffffffc6e,
                                  CONCAT11(in_stack_fffffffffffffc6d,in_stack_fffffffffffffc6c))),
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffcc8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x9dfc96);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9dfcee);
  local_2a8 = google::
              sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::max_size((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)0x9dfcfb);
  this_00 = (AssertHelper *)
            google::
            sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::max_bucket_count((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)0x9dfd1c);
  local_2b0 = this_00;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,
                                       CONCAT15(in_stack_fffffffffffffc6d,
                                                CONCAT14(in_stack_fffffffffffffc6c,
                                                         in_stack_fffffffffffffc68)))),
             (char *)in_stack_fffffffffffffc60,
             (unsigned_long *)
             CONCAT17(in_stack_fffffffffffffc5f,
                      CONCAT16(in_stack_fffffffffffffc5e,
                               CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58))),
             (unsigned_long *)in_stack_fffffffffffffc50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a0);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc7c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffc70 =
         (sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *
         )testing::AssertionResult::failure_message((AssertionResult *)0x9dfdc6);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffc70,
               CONCAT13(in_stack_fffffffffffffc6f,
                        CONCAT12(in_stack_fffffffffffffc6e,
                                 CONCAT11(in_stack_fffffffffffffc6d,in_stack_fffffffffffffc6c))),
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffcc8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x9dfe23);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9dfe7b);
  sVar2 = google::
          sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::
          max_size((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                    *)0x9dfe88);
  local_2d1 = sVar2;
  sVar3 = google::
          sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::
          max_bucket_count((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                            *)0x9dfea6);
  local_2d2 = sVar3;
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((char *)CONCAT17(sVar2,CONCAT16(sVar3,CONCAT15(in_stack_fffffffffffffc6d,
                                                            CONCAT14(in_stack_fffffffffffffc6c,
                                                                     in_stack_fffffffffffffc68)))),
             (char *)in_stack_fffffffffffffc60,
             (uchar *)CONCAT17(in_stack_fffffffffffffc5f,
                               CONCAT16(in_stack_fffffffffffffc5e,
                                        CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58
                                                ))),(uchar *)in_stack_fffffffffffffc50);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffc60 =
         (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x9dff4d);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffc70,
               CONCAT13(sVar2,CONCAT12(sVar3,CONCAT11(uVar4,in_stack_fffffffffffffc6c))),
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffcc8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x9dffaa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e0002);
  sVar5 = google::
          sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>::
          max_size((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>
                    *)0x9e000f);
  sVar6 = google::
          sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>::
          max_bucket_count((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>
                            *)0x9e002d);
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((char *)CONCAT17(sVar2,CONCAT16(sVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffc6c
                                                                           ,
                                                  in_stack_fffffffffffffc68)))),
             (char *)in_stack_fffffffffffffc60,
             (uchar *)CONCAT17(sVar5,CONCAT16(sVar6,CONCAT15(in_stack_fffffffffffffc5d,
                                                             in_stack_fffffffffffffc58))),
             (uchar *)in_stack_fffffffffffffc50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x9e00d4)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffc70,
               CONCAT13(sVar2,CONCAT12(sVar3,CONCAT11(uVar4,in_stack_fffffffffffffc6c))),
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffffcc8));
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x9e0131);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9e0186);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>::
  ~sparse_hash_set((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>
                    *)0x9e0193);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::
  ~sparse_hash_set((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                    *)0x9e01a0);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  ~sparse_hash_set((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)0x9e01ad);
  return;
}

Assistant:

TEST(HashtableTest, MaxSizeAndMaxBucketCount) {
  // The max size depends on the allocator.  So we can't use the
  // built-in allocator type; instead, we make our own types.
  sparse_hash_set<int, Hasher, Hasher, Alloc<int>> ht_default;
  sparse_hash_set<int, Hasher, Hasher, Alloc<int, unsigned char>> ht_char;
  sparse_hash_set<int, Hasher, Hasher, Alloc<int, unsigned char, 104>> ht_104;

  EXPECT_GE(ht_default.max_size(), 256u);
  EXPECT_EQ(255u, ht_char.max_size());
  EXPECT_EQ(104u, ht_104.max_size());

  // In our implementations, MaxBucketCount == MaxSize.
  EXPECT_EQ(ht_default.max_size(), ht_default.max_bucket_count());
  EXPECT_EQ(ht_char.max_size(), ht_char.max_bucket_count());
  EXPECT_EQ(ht_104.max_size(), ht_104.max_bucket_count());
}